

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O3

void __thiscall PyreNet::Layer::mutate_uniform(Layer *this,double lower,double upper)

{
  Perceptron *pPVar1;
  Perceptron *p;
  Perceptron *this_00;
  
  pPVar1 = (this->nodes).
           super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->nodes).
                 super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1)
  {
    Perceptron::mutate_uniform(this_00,lower,upper);
  }
  return;
}

Assistant:

void Layer::mutate_uniform(const double lower, const double upper) {
        for (Perceptron &p : this->nodes) {
            p.mutate_uniform(lower, upper);
        }
    }